

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O0

void search_min_f_dijkstra
               (vector<int,_std::allocator<int>_> *array,
               vector<bool,_std::allocator<bool>_> *conditional,int from,int to,int *min_dist)

{
  bool bVar1;
  reference pvVar2;
  byte local_41;
  reference local_40;
  int local_30;
  value_type local_2c;
  int i;
  int local_min;
  int *min_dist_local;
  int to_local;
  int from_local;
  vector<bool,_std::allocator<bool>_> *conditional_local;
  vector<int,_std::allocator<int>_> *array_local;
  
  local_2c = 999999;
  _i = min_dist;
  min_dist_local._0_4_ = to;
  min_dist_local._4_4_ = from;
  _to_local = conditional;
  conditional_local = (vector<bool,_std::allocator<bool>_> *)array;
  for (local_30 = from; local_30 <= (int)min_dist_local; local_30 = local_30 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)conditional_local,(long)local_30);
    local_41 = 0;
    if (*pvVar2 < local_2c) {
      local_40 = std::vector<bool,_std::allocator<bool>_>::operator[](_to_local,(long)local_30);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_40);
      local_41 = bVar1 ^ 0xff;
    }
    if ((local_41 & 1) != 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)conditional_local,(long)local_30);
      local_2c = *pvVar2;
    }
  }
  std::mutex::lock(&dijkstra_min_dist);
  if (local_2c < *_i) {
    *_i = local_2c;
  }
  std::mutex::unlock(&dijkstra_min_dist);
  return;
}

Assistant:

void search_min_f_dijkstra(vector<int>& array, vector<bool>& conditional, int from, int to, int& min_dist){
    int local_min = MAX_INT;
    for (int i=from; i<=to; i++){
        if (array[i] < local_min && !conditional[i]){
            local_min = array[i];
        }
    }
    dijkstra_min_dist.lock();
    if (local_min < min_dist){
        min_dist = local_min;
    }
    dijkstra_min_dist.unlock();
}